

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

string * __thiscall
Jupiter::Socket::resolveAddress_abi_cxx11_
          (string *__return_storage_ptr__,Socket *this,addrinfo *addr,uint result)

{
  addrinfo *this_00;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  addrinfo *ptr;
  uint result_local;
  addrinfo *addr_local;
  
  this_00 = getAddrInfo((addrinfo *)this,(uint)addr);
  if (this_00 == (addrinfo *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    resolveAddress_abi_cxx11_
              (__return_storage_ptr__,(Socket *)this_00,
               (addrinfo *)CONCAT44(extraout_var,extraout_EDX));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Jupiter::Socket::resolveAddress(addrinfo *addr, unsigned int result) { // static
	addrinfo *ptr = Jupiter::Socket::getAddrInfo(addr, result);
	if (ptr == nullptr) {
		return {};
	}

	return Jupiter::Socket::resolveAddress(ptr);
}